

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall BanMan::~BanMan(BanMan *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DumpBanlist(this);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_discouraged).data.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  CBanDB::~CBanDB(&this->m_ban_db);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::
    _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::~_Rb_tree(&(this->m_banned)._M_t);
    return;
  }
  __stack_chk_fail();
}

Assistant:

BanMan::~BanMan()
{
    DumpBanlist();
}